

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O0

FT_Error af_cjk_hints_detect_features(AF_GlyphHints hints,AF_Dimension dim)

{
  undefined4 local_18;
  FT_Error error;
  AF_Dimension dim_local;
  AF_GlyphHints hints_local;
  
  local_18 = af_cjk_hints_compute_segments(hints,dim);
  if (local_18 == 0) {
    af_cjk_hints_link_segments(hints,dim);
    local_18 = af_cjk_hints_compute_edges(hints,dim);
  }
  return local_18;
}

Assistant:

static FT_Error
  af_cjk_hints_detect_features( AF_GlyphHints  hints,
                                AF_Dimension   dim )
  {
    FT_Error  error;


    error = af_cjk_hints_compute_segments( hints, dim );
    if ( !error )
    {
      af_cjk_hints_link_segments( hints, dim );

      error = af_cjk_hints_compute_edges( hints, dim );
    }
    return error;
  }